

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::OwnFd::~OwnFd(OwnFd *this)

{
  int iVar1;
  int *piVar2;
  Fault local_18;
  Fault f;
  OwnFd *this_local;
  
  if ((-1 < this->fd) && (f.exception = (Exception *)this, iVar1 = close(this->fd), iVar1 < 0)) {
    piVar2 = __errno_location();
    _::Debug::Fault::Fault<int,int&>
              (&local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x14e,*piVar2,"close","fd",&this->fd);
    _::Debug::Fault::~Fault(&local_18);
  }
  return;
}

Assistant:

OwnFd::~OwnFd() noexcept(false) {
  if (fd >= 0) {
    // Don't use SYSCALL() here because close() should not be repeated on EINTR.
    if (miniposix::close(fd) < 0) {
      KJ_FAIL_SYSCALL("close", errno, fd) {
        // This ensures we don't throw an exception if unwinding.
        break;
      }
    }
  }
}